

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_layer_t.h
# Opt level: O3

range_t * __thiscall
conv_layer_t::map_to_output(range_t *__return_storage_ptr__,conv_layer_t *this,int x,int y)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  
  auVar6._4_12_ = in_ZMM0._4_12_;
  uVar1 = this->extend_filter;
  fVar7 = (float)this->stride;
  fVar10 = (((float)x + 1.0) - (float)uVar1) / fVar7;
  iVar2 = (this->super_layer_t).out.size.x;
  iVar4 = 0;
  iVar3 = 0;
  if ((0.0 < fVar10) && (iVar3 = iVar2 + -1, fVar10 < (float)iVar3)) {
    auVar8 = vroundss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),10);
    iVar3 = (int)auVar8._0_4_;
  }
  __return_storage_ptr__->min_x = iVar3;
  auVar8._0_4_ = (((float)y + 1.0) - (float)uVar1) / fVar7;
  auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
  iVar3 = (this->super_layer_t).out.size.y;
  if ((0.0 < auVar8._0_4_) && (iVar4 = iVar3 + -1, auVar8._0_4_ < (float)iVar4)) {
    auVar8 = vroundss_avx(auVar8,auVar8,10);
    iVar4 = (int)auVar8._0_4_;
  }
  __return_storage_ptr__->min_y = iVar4;
  __return_storage_ptr__->min_z = 0;
  auVar9._0_4_ = (float)x / fVar7;
  auVar9._4_12_ = auVar6._4_12_;
  iVar5 = 0;
  iVar4 = 0;
  if ((0.0 < auVar9._0_4_) && (iVar4 = iVar2 + -1, auVar9._0_4_ < (float)iVar4)) {
    auVar8 = vroundss_avx(auVar9,auVar9,9);
    iVar4 = (int)auVar8._0_4_;
  }
  __return_storage_ptr__->max_x = iVar4;
  auVar6._0_4_ = (float)y / fVar7;
  if ((0.0 < auVar6._0_4_) && (iVar5 = iVar3 + -1, auVar6._0_4_ < (float)iVar5)) {
    auVar6 = vroundss_avx(auVar6,auVar6,9);
    iVar5 = (int)auVar6._0_4_;
  }
  __return_storage_ptr__->max_y = iVar5;
  __return_storage_ptr__->max_z =
       (int)((ulong)((long)(this->filters).
                           super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->filters).
                          super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 + -1;
  return __return_storage_ptr__;
}

Assistant:

range_t map_to_output(int x, int y) {
    float a = x;
    float b = y;
    return
        {
            normalize_range((a - extend_filter + 1) / stride, out.size.x, true),
            normalize_range((b - extend_filter + 1) / stride, out.size.y, true),
            0,
            normalize_range(a / stride, out.size.x, false),
            normalize_range(b / stride, out.size.y, false),
            (int) filters.size() - 1,
        };
  }